

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdicc.c
# Opt level: O1

boolean jpeg_read_icc_profile(j_decompress_ptr cinfo,JOCTET **icc_data_ptr,uint *icc_data_len)

{
  byte bVar1;
  int iVar2;
  jpeg_error_mgr *pjVar3;
  JOCTET *pJVar4;
  boolean bVar5;
  ulong uVar6;
  JOCTET *pJVar7;
  uint uVar8;
  boolean bVar9;
  long lVar10;
  jpeg_saved_marker_ptr_conflict pjVar11;
  uint uVar12;
  bool bVar13;
  char marker_present [256];
  uint data_length [256];
  uint data_offset [256];
  char acStack_938 [256];
  int aiStack_838 [256];
  uint auStack_438 [258];
  
  if (icc_data_ptr == (JOCTET **)0x0 || icc_data_len == (uint *)0x0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x17;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  iVar2 = cinfo->global_state;
  if (iVar2 < 0xca) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x14;
    (pjVar3->msg_parm).i[0] = iVar2;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  *icc_data_ptr = (JOCTET *)0x0;
  *icc_data_len = 0;
  bVar9 = 0;
  memset(acStack_938 + 1,0,0xff);
  pjVar11 = cinfo->marker_list;
  uVar12 = 0;
  if (pjVar11 != (jpeg_saved_marker_ptr_conflict)0x0) {
    uVar12 = 0;
    do {
      bVar5 = marker_is_icc(pjVar11);
      if (bVar5 != 0) {
        uVar8 = (uint)pjVar11->data[0xd];
        if ((uVar12 != 0) && (bVar13 = uVar12 != uVar8, uVar8 = uVar12, bVar13)) goto LAB_00123c43;
        bVar1 = pjVar11->data[0xc];
        if ((bVar1 == 0) || ((uVar8 < bVar1 || (acStack_938[bVar1] != '\0')))) goto LAB_00123c43;
        acStack_938[bVar1] = '\x01';
        aiStack_838[bVar1] = pjVar11->data_length - 0xe;
        uVar12 = uVar8;
      }
      pjVar11 = pjVar11->next;
    } while (pjVar11 != (jpeg_saved_marker_ptr)0x0);
  }
  if (uVar12 != 0) {
    if (uVar12 == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      uVar6 = 1;
      do {
        if (acStack_938[uVar6] == '\0') goto LAB_00123c43;
        auStack_438[uVar6] = uVar8;
        uVar8 = uVar8 + aiStack_838[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar12 + 1 != uVar6);
    }
    if (uVar8 == 0) {
LAB_00123c43:
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x7f;
      (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
      bVar9 = 0;
    }
    else {
      pJVar7 = (JOCTET *)malloc((ulong)uVar8);
      if (pJVar7 == (JOCTET *)0x0) {
        *(undefined8 *)&cinfo->err->msg_code = 0xb00000036;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      for (pjVar11 = cinfo->marker_list; pjVar11 != (jpeg_saved_marker_ptr_conflict)0x0;
          pjVar11 = pjVar11->next) {
        bVar9 = marker_is_icc(pjVar11);
        if (bVar9 != 0) {
          pJVar4 = pjVar11->data;
          bVar1 = pJVar4[0xc];
          iVar2 = aiStack_838[bVar1];
          if (iVar2 != 0) {
            uVar12 = auStack_438[bVar1];
            lVar10 = 0;
            do {
              pJVar7[lVar10 + (ulong)uVar12] = pJVar4[lVar10 + 0xe];
              lVar10 = lVar10 + 1;
            } while (iVar2 != (int)lVar10);
          }
        }
      }
      *icc_data_ptr = pJVar7;
      *icc_data_len = uVar8;
      bVar9 = 1;
    }
  }
  return bVar9;
}

Assistant:

GLOBAL(boolean)
jpeg_read_icc_profile(j_decompress_ptr cinfo, JOCTET **icc_data_ptr,
                      unsigned int *icc_data_len)
{
  jpeg_saved_marker_ptr marker;
  int num_markers = 0;
  int seq_no;
  JOCTET *icc_data;
  unsigned int total_length;
#define MAX_SEQ_NO  255         /* sufficient since marker numbers are bytes */
  char marker_present[MAX_SEQ_NO + 1];      /* 1 if marker found */
  unsigned int data_length[MAX_SEQ_NO + 1]; /* size of profile data in marker */
  unsigned int data_offset[MAX_SEQ_NO + 1]; /* offset for data in marker */

  if (icc_data_ptr == NULL || icc_data_len == NULL)
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  if (cinfo->global_state < DSTATE_READY)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  *icc_data_ptr = NULL;         /* avoid confusion if FALSE return */
  *icc_data_len = 0;

  /* This first pass over the saved markers discovers whether there are
   * any ICC markers and verifies the consistency of the marker numbering.
   */

  for (seq_no = 1; seq_no <= MAX_SEQ_NO; seq_no++)
    marker_present[seq_no] = 0;

  for (marker = cinfo->marker_list; marker != NULL; marker = marker->next) {
    if (marker_is_icc(marker)) {
      if (num_markers == 0)
        num_markers = marker->data[13];
      else if (num_markers != marker->data[13]) {
        WARNMS(cinfo, JWRN_BOGUS_ICC);  /* inconsistent num_markers fields */
        return FALSE;
      }
      seq_no = marker->data[12];
      if (seq_no <= 0 || seq_no > num_markers) {
        WARNMS(cinfo, JWRN_BOGUS_ICC);  /* bogus sequence number */
        return FALSE;
      }
      if (marker_present[seq_no]) {
        WARNMS(cinfo, JWRN_BOGUS_ICC);  /* duplicate sequence numbers */
        return FALSE;
      }
      marker_present[seq_no] = 1;
      data_length[seq_no] = marker->data_length - ICC_OVERHEAD_LEN;
    }
  }

  if (num_markers == 0)
    return FALSE;

  /* Check for missing markers, count total space needed,
   * compute offset of each marker's part of the data.
   */

  total_length = 0;
  for (seq_no = 1; seq_no <= num_markers; seq_no++) {
    if (marker_present[seq_no] == 0) {
      WARNMS(cinfo, JWRN_BOGUS_ICC);  /* missing sequence number */
      return FALSE;
    }
    data_offset[seq_no] = total_length;
    total_length += data_length[seq_no];
  }

  if (total_length == 0) {
    WARNMS(cinfo, JWRN_BOGUS_ICC);  /* found only empty markers? */
    return FALSE;
  }

  /* Allocate space for assembled data */
  icc_data = (JOCTET *)malloc(total_length * sizeof(JOCTET));
  if (icc_data == NULL)
    ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 11);  /* oops, out of memory */

  /* and fill it in */
  for (marker = cinfo->marker_list; marker != NULL; marker = marker->next) {
    if (marker_is_icc(marker)) {
      JOCTET FAR *src_ptr;
      JOCTET *dst_ptr;
      unsigned int length;
      seq_no = marker->data[12];
      dst_ptr = icc_data + data_offset[seq_no];
      src_ptr = marker->data + ICC_OVERHEAD_LEN;
      length = data_length[seq_no];
      while (length--) {
        *dst_ptr++ = *src_ptr++;
      }
    }
  }

  *icc_data_ptr = icc_data;
  *icc_data_len = total_length;

  return TRUE;
}